

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.cc
# Opt level: O3

vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *
detectSmile(vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *__return_storage_ptr__,
           Mat *faces)

{
  CascadeClassifier smileCascade;
  CascadeClassifier local_58 [16];
  long *local_48;
  Mat *local_40;
  long local_38 [2];
  undefined8 local_28;
  undefined8 local_20;
  
  cv::CascadeClassifier::CascadeClassifier(local_58);
  (__return_storage_ptr__->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"/usr/local/share/opencv4/haarcascades/haarcascade_smile.xml","");
  cv::CascadeClassifier::load((string *)local_58);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  local_38[0] = 0;
  local_48 = (long *)CONCAT44(local_48._4_4_,0x1010000);
  local_20 = 0x1e0000001e;
  local_28 = 0;
  local_40 = faces;
  cv::CascadeClassifier::detectMultiScale
            (0x9999999a,local_58,&local_48,__return_storage_ptr__,2,2,&local_20,&local_28);
  cv::CascadeClassifier::~CascadeClassifier(local_58);
  return __return_storage_ptr__;
}

Assistant:

vector<Rect> detectSmile(Mat faces) {
  CascadeClassifier smileCascade;
  vector<Rect> smiles;
  smileCascade.load(
      "/usr/local/share/opencv4/haarcascades/haarcascade_smile.xml");
  smileCascade.detectMultiScale(faces, smiles, 1.1, 2, 0 | CASCADE_SCALE_IMAGE,
                                Size(30, 30));
  return smiles;
}